

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QByteArray>::eraseFirst(QGenericArrayOps<QByteArray> *this)

{
  long in_RDI;
  
  QArrayDataPointer<QByteArray>::begin((QArrayDataPointer<QByteArray> *)0x2abe8c);
  QByteArray::~QByteArray((QByteArray *)0x2abe94);
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 0x18;
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
  return;
}

Assistant:

void eraseFirst() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        this->begin()->~T();
        ++this->ptr;
        --this->size;
    }